

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  uint uVar1;
  uint uVar2;
  ImDrawVert *pIVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ImVec2 *p;
  uint *puVar8;
  ImVec2 triangle [3];
  ImVec2 local_70;
  ImRect local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58._0_4_ = (draw_cmd->ClipRect).x;
  local_58._4_4_ = (draw_cmd->ClipRect).y;
  uStack_50 = 0;
  local_48._0_4_ = (draw_cmd->ClipRect).z;
  local_48._4_4_ = (draw_cmd->ClipRect).w;
  uStack_40 = 0;
  local_68.Min.x = 3.4028235e+38;
  local_68.Min.y = 3.4028235e+38;
  local_68.Max.x = -3.4028235e+38;
  local_68.Max.y = -3.4028235e+38;
  uVar1 = out_draw_list->Flags;
  out_draw_list->Flags = uVar1 & 0xfffffffe;
  uVar7 = draw_cmd->IdxOffset;
  uVar4 = draw_cmd->ElemCount + uVar7;
  while (uVar7 < uVar4) {
    if ((draw_list->IdxBuffer).Size < 1) {
      puVar8 = (uint *)0x0;
    }
    else {
      puVar8 = (draw_list->IdxBuffer).Data;
    }
    uVar2 = draw_cmd->VtxOffset;
    pIVar3 = (draw_list->VtxBuffer).Data;
    triangle[0].x = 0.0;
    triangle[0].y = 0.0;
    triangle[1].x = 0.0;
    triangle[1].y = 0.0;
    triangle[2].x = 0.0;
    triangle[2].y = 0.0;
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
      uVar5 = uVar7;
      if (puVar8 != (uint *)0x0) {
        uVar5 = puVar8[uVar7];
      }
      p = (ImVec2 *)((long)&triangle[0].x + lVar6);
      *p = pIVar3[(ulong)uVar2 + (ulong)uVar5].pos;
      ImRect::Add(&local_68,p);
      uVar7 = uVar7 + 1;
    }
    if (show_mesh) {
      ImDrawList::AddPolyline(out_draw_list,triangle,3,0xff00ffff,1,1.0);
    }
  }
  if (show_aabb) {
    triangle[0].y = (float)(int)local_58._4_4_;
    triangle[0].x = (float)(int)(float)local_58;
    local_70.y = (float)(int)local_48._4_4_;
    local_70.x = (float)(int)(float)local_48;
    ImDrawList::AddRect(out_draw_list,triangle,&local_70,0xffff00ff,0.0,0,1.0);
    triangle[0].y = (float)(int)local_68.Min.y;
    triangle[0].x = (float)(int)local_68.Min.x;
    local_70.y = (float)(int)local_68.Max.y;
    local_70.x = (float)(int)local_68.Max.x;
    ImDrawList::AddRect(out_draw_list,triangle,&local_70,0xffffff00,0.0,0,1.0);
  }
  out_draw_list->Flags = uVar1;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset, idx_end = draw_cmd->IdxOffset + draw_cmd->ElemCount; idx_n < idx_end; )
    {
        ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL; // We don't hold on those pointers past iterations as ->AddPolyline() may invalidate them if out_draw_list==draw_list
        ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), ImDrawFlags_Closed, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImTrunc(clip_rect.Min), ImTrunc(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImTrunc(vtxs_rect.Min), ImTrunc(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}